

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d.c
# Opt level: O0

void av1_fwd_txfm2d_64x16_c(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  long in_RSI;
  TXFM_2D_FLIP_CFG cfg;
  int32_t txfm_buf [1024];
  TXFM_2D_FLIP_CFG *in_stack_ffffffffffffefa8;
  TX_SIZE in_stack_ffffffffffffefb6;
  TX_TYPE in_stack_ffffffffffffefb7;
  int in_stack_fffffffffffff0ec;
  int32_t *in_stack_fffffffffffff0f0;
  TXFM_2D_FLIP_CFG *in_stack_fffffffffffff0f8;
  int in_stack_fffffffffffff104;
  int32_t *in_stack_fffffffffffff108;
  int16_t *in_stack_fffffffffffff110;
  
  av1_get_fwd_txfm_cfg
            (in_stack_ffffffffffffefb7,in_stack_ffffffffffffefb6,in_stack_ffffffffffffefa8);
  fwd_txfm2d_c(in_stack_fffffffffffff110,in_stack_fffffffffffff108,in_stack_fffffffffffff104,
               in_stack_fffffffffffff0f8,in_stack_fffffffffffff0f0,in_stack_fffffffffffff0ec);
  memset((void *)(in_RSI + 0x800),0,0x800);
  return;
}

Assistant:

void av1_fwd_txfm2d_64x16_c(const int16_t *input, int32_t *output, int stride,
                            TX_TYPE tx_type, int bd) {
  int32_t txfm_buf[64 * 16];
  TXFM_2D_FLIP_CFG cfg;
  av1_get_fwd_txfm_cfg(tx_type, TX_64X16, &cfg);
  fwd_txfm2d_c(input, output, stride, &cfg, txfm_buf, bd);
  // Zero out the bottom 16x32 area.
  memset(output + 16 * 32, 0, 16 * 32 * sizeof(*output));
  // Note: no repacking needed here.
}